

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fUniformLocationTests.cpp
# Opt level: O1

float deqp::gles31::Functional::anon_unknown_0::UniformLocationCase::getExpectedValue
                (DataType type,int id,char *name)

{
  deUint32 dVar1;
  uint uVar2;
  DataType DVar3;
  
  dVar1 = deStringHash(name);
  uVar2 = ((uint)id >> 0x10 ^ id ^ 0x3d) * 9;
  uVar2 = (uVar2 >> 4 ^ uVar2) * 0x27d4eb2d;
  DVar3 = type;
  if ((((type - TYPE_SAMPLER_1D < 0x1e) && (DVar3 = TYPE_FLOAT_VEC4, 5 < type - TYPE_SAMPLER_1D)) &&
      (DVar3 = TYPE_INT_VEC4, 5 < type - TYPE_INT_SAMPLER_1D)) &&
     (DVar3 = TYPE_UINT_VEC4, 5 < type - TYPE_UINT_SAMPLER_1D)) {
    DVar3 = (uint)(type - TYPE_SAMPLER_1D_SHADOW < 5);
  }
  uVar2 = dVar1 + (uVar2 >> 0xf ^ uVar2);
  if (DVar3 - TYPE_INT < 4) {
    uVar2 = uVar2 & 0x7f;
  }
  else {
    if (DVar3 - TYPE_UINT < 4) {
      return (float)(int)(uVar2 / 0xff + (uVar2 / 0xff) * -0x100 + uVar2);
    }
    if (DVar3 - TYPE_FLOAT < 4) {
      return (float)(int)(uVar2 / 0xff + (uVar2 / 0xff) * -0x100 + uVar2) / 255.0;
    }
    if (3 < DVar3 - TYPE_BOOL) {
      return 0.0;
    }
    uVar2 = uVar2 & 1;
  }
  return (float)uVar2;
}

Assistant:

float UniformLocationCase::getExpectedValue (glu::DataType type, int id, const char* name)
{
	const deUint32	hash			= deStringHash(name) + deInt32Hash(id);

	glu::DataType	adjustedType	= type;

	if (glu::isDataTypeSampler(type))
		adjustedType = getDataTypeSamplerSampleType(type);

	if (glu::isDataTypeIntOrIVec(adjustedType))
		return float(hash%128);
	else if (glu::isDataTypeUintOrUVec(adjustedType))
		return float(hash%255);
	else if (glu::isDataTypeFloatOrVec(adjustedType))
		return float(hash%255)/255.0f;
	else if (glu::isDataTypeBoolOrBVec(adjustedType))
		return float(hash%2);
	else
		DE_FATAL("Unkown primitive type");

	return glu::TYPE_INVALID;
}